

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

string * __thiscall
deqp::gls::DrawTestSpec::usageTypeToString_abi_cxx11_
          (string *__return_storage_ptr__,DrawTestSpec *this,Usage usage)

{
  char *__s;
  char **ppcVar1;
  allocator<char> local_15;
  Type_conflict local_14;
  string *psStack_10;
  Usage usage_local;
  
  local_14 = (Type_conflict)this;
  psStack_10 = __return_storage_ptr__;
  ppcVar1 = de::getSizedArrayElement<9,9,char_const*>(&usageTypeToString::usages,local_14);
  __s = *ppcVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_15)
  ;
  std::allocator<char>::~allocator(&local_15);
  return __return_storage_ptr__;
}

Assistant:

std::string DrawTestSpec::usageTypeToString(Usage usage)
{
	static const char* usages[] =
	{
		"dynamic_draw",	// USAGE_DYNAMIC_DRAW = 0,
		"static_draw",	// USAGE_STATIC_DRAW,
		"stream_draw",	// USAGE_STREAM_DRAW,

		"stream_read",	// USAGE_STREAM_READ,
		"stream_copy",	// USAGE_STREAM_COPY,

		"static_read",	// USAGE_STATIC_READ,
		"static_copy",	// USAGE_STATIC_COPY,

		"dynamic_read",	// USAGE_DYNAMIC_READ,
		"dynamic_copy",	// USAGE_DYNAMIC_COPY,
	};

	return de::getSizedArrayElement<DrawTestSpec::USAGE_LAST>(usages, (int)usage);
}